

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

plutovg_canvas_t * plutovg_canvas_create(plutovg_surface_t *surface)

{
  undefined4 uVar1;
  undefined4 uVar2;
  plutovg_canvas_t *ppVar3;
  plutovg_surface_t *ppVar4;
  plutovg_path_t *ppVar5;
  plutovg_state_t *ppVar6;
  
  ppVar3 = (plutovg_canvas_t *)malloc(0x78);
  ppVar3->ref_count = 1;
  ppVar4 = plutovg_surface_reference(surface);
  ppVar3->surface = ppVar4;
  ppVar5 = plutovg_path_create();
  ppVar3->path = ppVar5;
  ppVar6 = plutovg_state_create();
  ppVar3->state = ppVar6;
  ppVar3->freed_state = (plutovg_state_t *)0x0;
  (ppVar3->clip_rect).x = 0.0;
  (ppVar3->clip_rect).y = 0.0;
  uVar1 = surface->width;
  uVar2 = surface->height;
  (ppVar3->clip_rect).w = (float)(int)uVar1;
  (ppVar3->clip_rect).h = (float)(int)uVar2;
  plutovg_span_buffer_init(&ppVar3->clip_spans);
  plutovg_span_buffer_init(&ppVar3->fill_spans);
  return ppVar3;
}

Assistant:

plutovg_canvas_t* plutovg_canvas_create(plutovg_surface_t* surface)
{
    plutovg_canvas_t* canvas = malloc(sizeof(plutovg_canvas_t));
    canvas->ref_count = 1;
    canvas->surface = plutovg_surface_reference(surface);
    canvas->path = plutovg_path_create();
    canvas->state = plutovg_state_create();
    canvas->freed_state = NULL;
    canvas->clip_rect = PLUTOVG_MAKE_RECT(0, 0, surface->width, surface->height);
    plutovg_span_buffer_init(&canvas->clip_spans);
    plutovg_span_buffer_init(&canvas->fill_spans);
    return canvas;
}